

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overdrawoptimizer.cpp
# Opt level: O2

void meshopt_optimizeOverdraw
               (uint *destination,uint *indices,size_t index_count,float *vertex_positions,
               size_t vertex_count,size_t vertex_positions_stride,float threshold)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_t i_2;
  uint *__dest;
  uint *puVar8;
  ulong uVar9;
  uint *puVar10;
  uint *puVar11;
  float *pfVar12;
  size_t sVar13;
  unsigned_short *puVar14;
  uint *puVar15;
  size_t i_6;
  uint uVar16;
  size_t i_1;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  size_t i;
  size_t it;
  ulong uVar23;
  uint *puVar24;
  ulong size;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  long local_2190;
  ulong local_2160;
  meshopt_Allocator allocator;
  uint timestamp;
  
  puVar15 = (uint *)vertex_positions_stride;
  memset(&allocator,0,200);
  if (vertex_count != 0 && index_count != 0) {
    __dest = indices;
    if (destination == indices) {
      __dest = meshopt_Allocator::allocate<unsigned_int>(&allocator,index_count);
      memcpy(__dest,indices,index_count * 4);
    }
    puVar8 = meshopt_Allocator::allocate<unsigned_int>(&allocator,vertex_count);
    uVar9 = index_count / 3;
    puVar10 = meshopt_Allocator::allocate<unsigned_int>(&allocator,uVar9);
    memset(puVar8,0,vertex_count << 2);
    timestamp = 0x11;
    puVar11 = __dest + 2;
    local_2160 = 0;
    for (uVar23 = 0; uVar5 = (uint)puVar8, uVar9 != uVar23; uVar23 = uVar23 + 1) {
      uVar5 = meshopt::updateCache(puVar11[-2],puVar11[-1],*puVar11,uVar5,&timestamp,puVar15);
      if ((uVar23 == 0) || (uVar5 == 3)) {
        puVar10[local_2160] = (uint)uVar23;
        local_2160 = local_2160 + 1;
      }
      puVar11 = puVar11 + 3;
    }
    puVar11 = meshopt_Allocator::allocate<unsigned_int>(&allocator,uVar9 + 1);
    memset(puVar8,0,vertex_count << 2);
    timestamp = 0;
    size = 0;
    uVar23 = 0;
    while (uVar23 != local_2160) {
      uVar1 = uVar23 + 1;
      uVar18 = uVar9;
      if (uVar1 < local_2160) {
        uVar18 = (ulong)puVar10[uVar1];
      }
      uVar4 = puVar10[uVar23];
      uVar17 = (ulong)uVar4;
      timestamp = timestamp + 0x11;
      puVar24 = __dest + uVar17 * 3 + 2;
      uVar16 = 0;
      puVar8 = puVar24;
      for (uVar23 = uVar17; uVar23 < uVar18; uVar23 = uVar23 + 1) {
        uVar6 = meshopt::updateCache(puVar8[-2],puVar8[-1],*puVar8,uVar5,&timestamp,puVar15);
        uVar16 = uVar16 + uVar6;
        puVar8 = puVar8 + 3;
      }
      uVar23 = uVar18 - uVar17;
      puVar11[size] = uVar4;
      timestamp = timestamp + 0x11;
      local_2190 = size + 1;
      uVar6 = 0;
      uVar22 = 0;
      for (; uVar17 < uVar18; uVar17 = uVar17 + 1) {
        uVar7 = meshopt::updateCache(puVar24[-2],puVar24[-1],*puVar24,uVar5,&timestamp,puVar15);
        uVar6 = uVar7 + uVar6;
        uVar22 = uVar22 + 1;
        if ((float)uVar6 / (float)uVar22 <= ((float)uVar16 / (float)uVar23) * threshold) {
          puVar11[local_2190] = (int)uVar17 + 1;
          timestamp = timestamp + 0x11;
          local_2190 = local_2190 + 1;
          uVar6 = 0;
          uVar22 = 0;
        }
        puVar24 = puVar24 + 3;
      }
      size = local_2190 - (ulong)(puVar11[local_2190 + -1] != uVar4);
      uVar23 = uVar1;
    }
    pfVar12 = meshopt_Allocator::allocate<float>(&allocator,size);
    uVar9 = vertex_positions_stride >> 2;
    fVar29 = 0.0;
    fVar30 = 0.0;
    fVar31 = 0.0;
    for (sVar13 = 0; index_count != sVar13; sVar13 = sVar13 + 1) {
      fVar29 = fVar29 + (float)*(undefined8 *)(vertex_positions + __dest[sVar13] * uVar9);
      fVar30 = fVar30 + (float)((ulong)*(undefined8 *)(vertex_positions + __dest[sVar13] * uVar9) >>
                               0x20);
      fVar31 = fVar31 + vertex_positions[__dest[sVar13] * uVar9 + 2];
    }
    fVar25 = (float)index_count;
    uVar23 = 0;
    while (uVar23 != size) {
      uVar1 = uVar23 + 1;
      sVar13 = index_count;
      if (uVar1 < size) {
        sVar13 = (size_t)(puVar11[uVar1] * 3);
      }
      fVar42 = 0.0;
      fVar43 = 0.0;
      fVar37 = 0.0;
      fVar39 = 0.0;
      fVar38 = 0.0;
      fVar40 = 0.0;
      fVar41 = 0.0;
      for (uVar18 = (ulong)(puVar11[uVar23] * 3); uVar18 < sVar13; uVar18 = uVar18 + 3) {
        lVar20 = __dest[uVar18] * uVar9;
        lVar19 = __dest[uVar18 + 1] * uVar9;
        lVar21 = __dest[uVar18 + 2] * uVar9;
        fVar27 = vertex_positions[lVar20];
        fVar2 = vertex_positions[lVar20 + 1];
        fVar35 = vertex_positions[lVar19 + 1] - fVar2;
        fVar3 = vertex_positions[lVar20 + 2];
        fVar44 = vertex_positions[lVar19 + 2] - fVar3;
        fVar33 = vertex_positions[lVar21] - fVar27;
        fVar26 = vertex_positions[lVar21 + 1] - fVar2;
        fVar34 = vertex_positions[lVar21 + 2] - fVar3;
        fVar36 = fVar35 * fVar34 - fVar26 * fVar44;
        fVar32 = vertex_positions[lVar19] - fVar27;
        fVar34 = fVar44 * fVar33 - fVar34 * fVar32;
        fVar26 = fVar26 * fVar32 - fVar33 * fVar35;
        fVar39 = fVar39 + fVar36;
        fVar37 = fVar37 + fVar26;
        fVar26 = SQRT(fVar26 * fVar26 + fVar36 * fVar36 + fVar34 * fVar34);
        fVar38 = fVar38 + fVar26;
        fVar26 = fVar26 / 3.0;
        fVar40 = fVar40 + fVar26 * (vertex_positions[lVar21 + 2] +
                                   fVar3 + vertex_positions[lVar19 + 2]);
        fVar41 = fVar41 + fVar26 * (vertex_positions[lVar21] + fVar27 + vertex_positions[lVar19]);
        fVar42 = (vertex_positions[lVar19 + 1] + fVar2 + vertex_positions[lVar21 + 1]) * fVar26 +
                 fVar42;
        fVar43 = fVar43 + fVar34;
      }
      fVar27 = SQRT(fVar37 * fVar37 + fVar39 * fVar39 + fVar43 * fVar43);
      auVar28._4_4_ = fVar27;
      auVar28._0_4_ = fVar38;
      auVar28._8_8_ = 0;
      auVar28 = divps(_DAT_00274b70,auVar28);
      fVar38 = (float)(-(uint)(fVar38 != 0.0) & auVar28._0_4_);
      fVar27 = (float)(-(uint)(fVar27 != 0.0) & auVar28._4_4_);
      pfVar12[uVar23] =
           fVar27 * fVar43 * (fVar38 * fVar42 - fVar30 / fVar25) +
           fVar39 * fVar27 * (fVar41 * fVar38 - fVar29 / fVar25) +
           fVar37 * fVar27 * (fVar40 * fVar38 - fVar31 / fVar25);
      uVar23 = uVar1;
    }
    puVar14 = meshopt_Allocator::allocate<unsigned_short>(&allocator,size);
    puVar15 = meshopt_Allocator::allocate<unsigned_int>(&allocator,size);
    fVar29 = 0.001;
    for (uVar9 = 0; size != uVar9; uVar9 = uVar9 + 1) {
      fVar30 = ABS(pfVar12[uVar9]);
      if (ABS(pfVar12[uVar9]) <= fVar29) {
        fVar30 = fVar29;
      }
      fVar29 = fVar30;
    }
    for (uVar9 = 0; size != uVar9; uVar9 = uVar9 + 1) {
      fVar30 = (pfVar12[uVar9] / fVar29) * -0.5 + 0.5;
      fVar30 = (float)(-(uint)(0.0 <= fVar30) & (uint)fVar30);
      if (1.0 <= fVar30) {
        fVar30 = 1.0;
      }
      puVar14[uVar9] = (ushort)(int)(fVar30 * 2047.0 + 0.5) & 0x7ff;
    }
    memset(&timestamp,0,0x2000);
    for (uVar9 = 0; size != uVar9; uVar9 = uVar9 + 1) {
      (&timestamp)[puVar14[uVar9]] = (&timestamp)[puVar14[uVar9]] + 1;
    }
    uVar5 = 0;
    for (lVar19 = 0; lVar19 != 0x800; lVar19 = lVar19 + 1) {
      uVar4 = (&timestamp)[lVar19];
      (&timestamp)[lVar19] = uVar5;
      uVar5 = uVar4 + uVar5;
    }
    for (uVar9 = 0; size != uVar9; uVar9 = uVar9 + 1) {
      uVar5 = (&timestamp)[puVar14[uVar9]];
      (&timestamp)[puVar14[uVar9]] = uVar5 + 1;
      puVar15[uVar5] = (uint)uVar9;
    }
    lVar19 = 0;
    for (uVar9 = 0; size != uVar9; uVar9 = uVar9 + 1) {
      uVar23 = (ulong)(puVar15[uVar9] + 1);
      sVar13 = index_count;
      if (uVar23 < size) {
        sVar13 = (size_t)(puVar11[uVar23] * 3);
      }
      lVar20 = sVar13 - puVar11[puVar15[uVar9]] * 3;
      memcpy(destination + lVar19,__dest + puVar11[puVar15[uVar9]] * 3,lVar20 * 4);
      lVar19 = lVar19 + lVar20;
    }
  }
  meshopt_Allocator::~meshopt_Allocator(&allocator);
  return;
}

Assistant:

void meshopt_optimizeOverdraw(unsigned int* destination, const unsigned int* indices, size_t index_count, const float* vertex_positions, size_t vertex_count, size_t vertex_positions_stride, float threshold)
{
	using namespace meshopt;

	assert(index_count % 3 == 0);
	assert(vertex_positions_stride > 0 && vertex_positions_stride <= 256);
	assert(vertex_positions_stride % sizeof(float) == 0);

	meshopt_Allocator allocator;

	// guard for empty meshes
	if (index_count == 0 || vertex_count == 0)
		return;

	// support in-place optimization
	if (destination == indices)
	{
		unsigned int* indices_copy = allocator.allocate<unsigned int>(index_count);
		memcpy(indices_copy, indices, index_count * sizeof(unsigned int));
		indices = indices_copy;
	}

	unsigned int cache_size = 16;

	unsigned int* cache_timestamps = allocator.allocate<unsigned int>(vertex_count);

	// generate hard boundaries from full-triangle cache misses
	unsigned int* hard_clusters = allocator.allocate<unsigned int>(index_count / 3);
	size_t hard_cluster_count = generateHardBoundaries(hard_clusters, indices, index_count, vertex_count, cache_size, cache_timestamps);

	// generate soft boundaries
	unsigned int* soft_clusters = allocator.allocate<unsigned int>(index_count / 3 + 1);
	size_t soft_cluster_count = generateSoftBoundaries(soft_clusters, indices, index_count, vertex_count, hard_clusters, hard_cluster_count, cache_size, threshold, cache_timestamps);

	const unsigned int* clusters = soft_clusters;
	size_t cluster_count = soft_cluster_count;

	// fill sort data
	float* sort_data = allocator.allocate<float>(cluster_count);
	calculateSortData(sort_data, indices, index_count, vertex_positions, vertex_positions_stride, clusters, cluster_count);

	// sort clusters using sort data
	unsigned short* sort_keys = allocator.allocate<unsigned short>(cluster_count);
	unsigned int* sort_order = allocator.allocate<unsigned int>(cluster_count);
	calculateSortOrderRadix(sort_order, sort_data, sort_keys, cluster_count);

	// fill output buffer
	size_t offset = 0;

	for (size_t it = 0; it < cluster_count; ++it)
	{
		unsigned int cluster = sort_order[it];
		assert(cluster < cluster_count);

		size_t cluster_begin = clusters[cluster] * 3;
		size_t cluster_end = (cluster + 1 < cluster_count) ? clusters[cluster + 1] * 3 : index_count;
		assert(cluster_begin < cluster_end);

		memcpy(destination + offset, indices + cluster_begin, (cluster_end - cluster_begin) * sizeof(unsigned int));
		offset += cluster_end - cluster_begin;
	}

	assert(offset == index_count);
}